

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_function_call(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options)

{
  int iVar1;
  LY_ERR LVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  lyxp_set *plVar6;
  lyxp_set **pplVar7;
  ulong uVar8;
  lyxp_set **args_aux;
  lyxp_set **args;
  uint32_t i;
  uint32_t arg_count;
  _func_LY_ERR_lyxp_set_ptr_ptr_uint32_t_lyxp_set_ptr_uint32_t *xpath_func;
  LY_ERR rc;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  _i = (code *)0x0;
  args._4_4_ = 0;
  args_aux = (lyxp_set **)0x0;
  if ((options & 0x20) == 0) {
    switch(exp->tok_len[*tok_idx]) {
    case 3:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"not",3);
      if (iVar1 == 0) {
        _i = xpath_not;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"sum",3);
        if (iVar1 == 0) {
          _i = xpath_sum;
        }
      }
      break;
    case 4:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"lang",4);
      if (iVar1 == 0) {
        _i = xpath_lang;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"last",4);
        if (iVar1 == 0) {
          _i = xpath_last;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"name",4);
          if (iVar1 == 0) {
            _i = xpath_name;
          }
          else {
            iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"true",4);
            if (iVar1 == 0) {
              _i = xpath_true;
            }
          }
        }
      }
      break;
    case 5:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"count",5);
      if (iVar1 == 0) {
        _i = xpath_count;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"false",5);
        if (iVar1 == 0) {
          _i = xpath_false;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"floor",5);
          if (iVar1 == 0) {
            _i = xpath_floor;
          }
          else {
            iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"round",5);
            if (iVar1 == 0) {
              _i = xpath_round;
            }
            else {
              iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"deref",5);
              if (iVar1 == 0) {
                _i = xpath_deref;
              }
            }
          }
        }
      }
      break;
    case 6:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"concat",6);
      if (iVar1 == 0) {
        _i = xpath_concat;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"number",6);
        if (iVar1 == 0) {
          _i = xpath_number;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"string",6);
          if (iVar1 == 0) {
            _i = xpath_string;
          }
        }
      }
      break;
    case 7:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"boolean",7);
      if (iVar1 == 0) {
        _i = xpath_boolean;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"ceiling",7);
        if (iVar1 == 0) {
          _i = xpath_ceiling;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"current",7);
          if (iVar1 == 0) {
            _i = xpath_current;
          }
        }
      }
      break;
    case 8:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"contains",8);
      if (iVar1 == 0) {
        _i = xpath_contains;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"position",8);
        if (iVar1 == 0) {
          _i = xpath_position;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"re-match",8);
          if (iVar1 == 0) {
            _i = xpath_re_match;
          }
        }
      }
      break;
    case 9:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"substring",9);
      if (iVar1 == 0) {
        _i = xpath_substring;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"translate",9);
        if (iVar1 == 0) {
          _i = xpath_translate;
        }
      }
      break;
    case 10:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"local-name",10);
      if (iVar1 == 0) {
        _i = xpath_local_name;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"enum-value",10);
        if (iVar1 == 0) {
          _i = xpath_enum_value;
        }
        else {
          iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"bit-is-set",10);
          if (iVar1 == 0) {
            _i = xpath_bit_is_set;
          }
        }
      }
      break;
    case 0xb:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"starts-with",0xb);
      if (iVar1 == 0) {
        _i = xpath_starts_with;
      }
      break;
    case 0xc:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"derived-from",0xc);
      if (iVar1 == 0) {
        _i = xpath_derived_from;
      }
      break;
    case 0xd:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"namespace-uri",0xd);
      if (iVar1 == 0) {
        _i = xpath_namespace_uri;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"string-length",0xd);
        if (iVar1 == 0) {
          _i = xpath_string_length;
        }
      }
      break;
    case 0xf:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"normalize-space",0xf);
      if (iVar1 == 0) {
        _i = xpath_normalize_space;
      }
      else {
        iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"substring-after",0xf);
        if (iVar1 == 0) {
          _i = xpath_substring_after;
        }
      }
      break;
    case 0x10:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"substring-before",0x10);
      if (iVar1 == 0) {
        _i = xpath_substring_before;
      }
      break;
    case 0x14:
      iVar1 = strncmp(exp->expr + exp->tok_pos[*tok_idx],"derived-from-or-self",0x14);
      if (iVar1 == 0) {
        _i = xpath_derived_from_or_self;
      }
    }
    if (_i == (code *)0x0) {
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Unknown XPath function \"%.*s\".",
              (ulong)exp->tok_len[*tok_idx],exp->expr + exp->tok_pos[*tok_idx]);
      return LY_EVALID;
    }
  }
  pcVar4 = "parsed";
  if ((options & 0x20) != 0) {
    pcVar4 = "skipped";
  }
  pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar4,pcVar5,(ulong)exp->tok_pos[*tok_idx]);
  *tok_idx = *tok_idx + 1;
  if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR1) {
    __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x21fe,
                  "LY_ERR eval_function_call(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t)"
                 );
  }
  pcVar4 = "parsed";
  if ((options & 0x20) != 0) {
    pcVar4 = "skipped";
  }
  pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar4,pcVar5,(ulong)exp->tok_pos[*tok_idx]);
  *tok_idx = *tok_idx + 1;
  if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR2) {
    if ((options & 0x20) != 0) {
      xpath_func._0_4_ = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
      goto joined_r0x0021c7d3;
    }
    args_aux = (lyxp_set **)malloc(8);
    if (args_aux == (lyxp_set **)0x0) {
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","eval_function_call");
      xpath_func._0_4_ = LY_EMEM;
      uVar3 = args._4_4_;
      goto LAB_0021cac9;
    }
    args._4_4_ = 1;
    plVar6 = set_copy(set);
    *args_aux = plVar6;
    uVar3 = args._4_4_;
    if (*args_aux == (lyxp_set *)0x0) {
      xpath_func._0_4_ = LY_EMEM;
      goto LAB_0021cac9;
    }
    xpath_func._0_4_ = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,*args_aux,options);
    if ((LY_ERR)xpath_func != LY_SUCCESS) goto LAB_0021cac9;
    set->not_found = (*args_aux)->not_found;
  }
  do {
    while( true ) {
      LVar2 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_COMMA);
      uVar3 = args._4_4_;
      if (LVar2 != LY_SUCCESS) {
        if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR2) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2233,
                        "LY_ERR eval_function_call(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t)"
                       );
        }
        pcVar4 = "parsed";
        if ((options & 0x20) != 0) {
          pcVar4 = "skipped";
        }
        pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar4,pcVar5,
                   (ulong)exp->tok_pos[*tok_idx]);
        *tok_idx = *tok_idx + 1;
        if ((options & 0x20) == 0) {
          xpath_func._0_4_ = (*_i)(args_aux,args._4_4_,set,options);
          if ((options & 0x1c) != 0) {
            for (args._0_4_ = 0; (uint)args < args._4_4_; args._0_4_ = (uint)args + 1) {
              set_scnode_clear_ctx(args_aux[(uint)args],0);
              lyxp_set_scnode_merge(set,args_aux[(uint)args]);
            }
          }
        }
        else {
          xpath_func._0_4_ = LY_SUCCESS;
        }
        goto LAB_0021cac9;
      }
      pcVar4 = "parsed";
      if ((options & 0x20) != 0) {
        pcVar4 = "skipped";
      }
      pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar4,pcVar5,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      if ((options & 0x20) != 0) break;
      uVar3 = args._4_4_ + 1;
      pplVar7 = (lyxp_set **)realloc(args_aux,(ulong)uVar3 << 3);
      if (pplVar7 == (lyxp_set **)0x0) {
        ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","eval_function_call");
        xpath_func._0_4_ = LY_EMEM;
        uVar3 = args._4_4_;
        goto LAB_0021cac9;
      }
      plVar6 = set_copy(set);
      pplVar7[args._4_4_] = plVar6;
      args_aux = pplVar7;
      if (pplVar7[args._4_4_] == (lyxp_set *)0x0) {
        xpath_func._0_4_ = LY_EMEM;
        goto LAB_0021cac9;
      }
      xpath_func._0_4_ = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,pplVar7[args._4_4_],options);
      if ((LY_ERR)xpath_func != LY_SUCCESS) goto LAB_0021cac9;
      uVar8 = (ulong)args._4_4_;
      args._4_4_ = uVar3;
      if (pplVar7[uVar8]->not_found != '\0') {
        set->not_found = '\x01';
      }
    }
    xpath_func._0_4_ = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
joined_r0x0021c7d3:
    uVar3 = args._4_4_;
  } while ((LY_ERR)xpath_func == LY_SUCCESS);
LAB_0021cac9:
  args._4_4_ = uVar3;
  for (args._0_4_ = 0; (uint)args < args._4_4_; args._0_4_ = (uint)args + 1) {
    lyxp_set_free(args_aux[(uint)args]);
  }
  free(args_aux);
  return (LY_ERR)xpath_func;
}

Assistant:

static LY_ERR
eval_function_call(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options)
{
    LY_ERR rc;

    LY_ERR (*xpath_func)(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t) = NULL;
    uint32_t arg_count = 0, i;
    struct lyxp_set **args = NULL, **args_aux;

    if (!(options & LYXP_SKIP_EXPR)) {
        /* FunctionName */
        switch (exp->tok_len[*tok_idx]) {
        case 3:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "not", 3)) {
                xpath_func = &xpath_not;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "sum", 3)) {
                xpath_func = &xpath_sum;
            }
            break;
        case 4:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "lang", 4)) {
                xpath_func = &xpath_lang;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "last", 4)) {
                xpath_func = &xpath_last;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "name", 4)) {
                xpath_func = &xpath_name;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "true", 4)) {
                xpath_func = &xpath_true;
            }
            break;
        case 5:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "count", 5)) {
                xpath_func = &xpath_count;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "false", 5)) {
                xpath_func = &xpath_false;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "floor", 5)) {
                xpath_func = &xpath_floor;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "round", 5)) {
                xpath_func = &xpath_round;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "deref", 5)) {
                xpath_func = &xpath_deref;
            }
            break;
        case 6:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "concat", 6)) {
                xpath_func = &xpath_concat;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "number", 6)) {
                xpath_func = &xpath_number;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "string", 6)) {
                xpath_func = &xpath_string;
            }
            break;
        case 7:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "boolean", 7)) {
                xpath_func = &xpath_boolean;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "ceiling", 7)) {
                xpath_func = &xpath_ceiling;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "current", 7)) {
                xpath_func = &xpath_current;
            }
            break;
        case 8:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "contains", 8)) {
                xpath_func = &xpath_contains;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "position", 8)) {
                xpath_func = &xpath_position;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "re-match", 8)) {
                xpath_func = &xpath_re_match;
            }
            break;
        case 9:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring", 9)) {
                xpath_func = &xpath_substring;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "translate", 9)) {
                xpath_func = &xpath_translate;
            }
            break;
        case 10:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "local-name", 10)) {
                xpath_func = &xpath_local_name;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "enum-value", 10)) {
                xpath_func = &xpath_enum_value;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "bit-is-set", 10)) {
                xpath_func = &xpath_bit_is_set;
            }
            break;
        case 11:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "starts-with", 11)) {
                xpath_func = &xpath_starts_with;
            }
            break;
        case 12:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "derived-from", 12)) {
                xpath_func = &xpath_derived_from;
            }
            break;
        case 13:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "namespace-uri", 13)) {
                xpath_func = &xpath_namespace_uri;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "string-length", 13)) {
                xpath_func = &xpath_string_length;
            }
            break;
        case 15:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "normalize-space", 15)) {
                xpath_func = &xpath_normalize_space;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring-after", 15)) {
                xpath_func = &xpath_substring_after;
            }
            break;
        case 16:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring-before", 16)) {
                xpath_func = &xpath_substring_before;
            }
            break;
        case 20:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "derived-from-or-self", 20)) {
                xpath_func = &xpath_derived_from_or_self;
            }
            break;
        }

        if (!xpath_func) {
            LOGVAL(set->ctx, LY_VCODE_XP_INFUNC, (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]]);
            return LY_EVALID;
        }
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    /* '(' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    /* ( Expr ( ',' Expr )* )? */
    if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR2) {
        if (!(options & LYXP_SKIP_EXPR)) {
            args = malloc(sizeof *args);
            LY_CHECK_ERR_GOTO(!args, LOGMEM(set->ctx); rc = LY_EMEM, cleanup);
            arg_count = 1;
            args[0] = set_copy(set);
            if (!args[0]) {
                rc = LY_EMEM;
                goto cleanup;
            }

            rc = eval_expr_select(exp, tok_idx, 0, args[0], options);
            LY_CHECK_GOTO(rc, cleanup);
            set->not_found = args[0]->not_found;
        } else {
            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            LY_CHECK_GOTO(rc, cleanup);
        }
    }
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_COMMA)) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        if (!(options & LYXP_SKIP_EXPR)) {
            ++arg_count;
            args_aux = realloc(args, arg_count * sizeof *args);
            LY_CHECK_ERR_GOTO(!args_aux, arg_count--; LOGMEM(set->ctx); rc = LY_EMEM, cleanup);
            args = args_aux;
            args[arg_count - 1] = set_copy(set);
            if (!args[arg_count - 1]) {
                rc = LY_EMEM;
                goto cleanup;
            }

            rc = eval_expr_select(exp, tok_idx, 0, args[arg_count - 1], options);
            LY_CHECK_GOTO(rc, cleanup);
            if (args[arg_count - 1]->not_found) {
                set->not_found = 1;
            }
        } else {
            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            LY_CHECK_GOTO(rc, cleanup);
        }
    }

    /* ')' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    if (!(options & LYXP_SKIP_EXPR)) {
        /* evaluate function */
        rc = xpath_func(args, arg_count, set, options);

        if (options & LYXP_SCNODE_ALL) {
            /* merge all nodes from arg evaluations */
            for (i = 0; i < arg_count; ++i) {
                set_scnode_clear_ctx(args[i], LYXP_SET_SCNODE_ATOM_NODE);
                lyxp_set_scnode_merge(set, args[i]);
            }
        }
    } else {
        rc = LY_SUCCESS;
    }

cleanup:
    for (i = 0; i < arg_count; ++i) {
        lyxp_set_free(args[i]);
    }
    free(args);
    return rc;
}